

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void BrotliStoreMetaBlock
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               uint8_t prev_byte,uint8_t prev_byte2,int is_last,BrotliEncoderParams *params,
               ContextType literal_context_mode,Command *commands,size_t n_commands,
               MetaBlockSplit *mb,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  HuffmanTree *tree;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  size_t j;
  HistogramLiteral *histogram;
  HistogramCommand *histogram_00;
  HistogramDistance *histogram_01;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  size_t sVar19;
  BlockEncoder literal_enc;
  BlockEncoder command_enc;
  BlockEncoder distance_enc;
  uint local_ba4;
  BlockEncoder local_b58;
  BlockEncoder local_7a0;
  BlockEncoder local_3e8;
  
  local_ba4 = (uint)prev_byte;
  uVar17 = (params->dist).alphabet_size;
  uVar18 = 0x220;
  if (uVar17 < 0x220) {
    uVar18 = uVar17;
  }
  if (params->large_window == 0) {
    uVar18 = uVar17;
  }
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  tree = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  local_b58.block_types_ = (mb->literal_split).types;
  local_b58.block_lengths_ = (mb->literal_split).lengths;
  local_b58.num_block_types_ = (mb->literal_split).num_types;
  local_b58.num_blocks_ = (mb->literal_split).num_blocks;
  local_b58.histogram_length_ = 0x100;
  local_b58.block_split_code_.type_code_calculator.last_type = 1;
  local_b58.block_len_ = 0;
  local_b58.block_split_code_.type_code_calculator.second_last_type = 0;
  local_b58.block_ix_ = 0;
  if (local_b58.num_blocks_ != 0) {
    local_b58.block_len_ = (size_t)*local_b58.block_lengths_;
  }
  local_b58.entropy_ix_ = 0;
  local_b58.depths_ = (uint8_t *)0x0;
  local_7a0.block_len_ = 0;
  local_b58.bits_ = (uint16_t *)0x0;
  local_7a0.block_types_ = (mb->command_split).types;
  local_7a0.block_lengths_ = (mb->command_split).lengths;
  local_7a0.num_block_types_ = (mb->command_split).num_types;
  local_7a0.num_blocks_ = (mb->command_split).num_blocks;
  local_7a0.histogram_length_ = 0x2c0;
  local_7a0.block_split_code_.type_code_calculator.last_type = 1;
  local_7a0.block_split_code_.type_code_calculator.second_last_type = 0;
  local_7a0.block_ix_ = 0;
  if (local_7a0.num_blocks_ != 0) {
    local_7a0.block_len_ = (size_t)*local_7a0.block_lengths_;
  }
  local_7a0.entropy_ix_ = 0;
  local_7a0.depths_ = (uint8_t *)0x0;
  local_3e8.block_len_ = 0;
  local_7a0.bits_ = (uint16_t *)0x0;
  local_3e8.block_types_ = (mb->distance_split).types;
  local_3e8.block_lengths_ = (mb->distance_split).lengths;
  local_3e8.num_block_types_ = (mb->distance_split).num_types;
  local_3e8.num_blocks_ = (mb->distance_split).num_blocks;
  local_3e8.block_split_code_.type_code_calculator.last_type = 1;
  local_3e8.block_split_code_.type_code_calculator.second_last_type = 0;
  local_3e8.block_ix_ = 0;
  if (local_3e8.num_blocks_ != 0) {
    local_3e8.block_len_ = (size_t)*local_3e8.block_lengths_;
  }
  local_3e8.entropy_ix_ = 0;
  local_3e8.depths_ = (uint8_t *)0x0;
  local_3e8.bits_ = (uint16_t *)0x0;
  local_3e8.histogram_length_ = (ulong)uVar18;
  BuildAndStoreBlockSwitchEntropyCodes(&local_b58,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(&local_7a0,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(&local_3e8,tree,storage_ix,storage);
  uVar18 = (params->dist).distance_postfix_bits;
  uVar12 = *storage_ix;
  *(ulong *)(storage + (uVar12 >> 3)) =
       (ulong)uVar18 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
  uVar11 = uVar12 + 2;
  *storage_ix = uVar11;
  *(ulong *)(storage + (uVar11 >> 3)) =
       (ulong)((params->dist).num_direct_distance_codes >> ((byte)uVar18 & 0x1f)) <<
       ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
  *storage_ix = uVar12 + 6;
  if ((mb->literal_split).num_types != 0) {
    uVar11 = 0;
    do {
      uVar12 = *storage_ix;
      *(ulong *)(storage + (uVar12 >> 3)) =
           (ulong)literal_context_mode << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
      *storage_ix = uVar12 + 2;
      uVar11 = uVar11 + 1;
    } while (uVar11 < (mb->literal_split).num_types);
  }
  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(mb->literal_histograms_size,6,tree,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,mb->literal_context_map,mb->literal_context_map_size,
                     mb->literal_histograms_size,tree,storage_ix,storage);
  }
  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(mb->distance_histograms_size,2,tree,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,mb->distance_context_map,mb->distance_context_map_size,
                     mb->distance_histograms_size,tree,storage_ix,storage);
  }
  histogram = mb->literal_histograms;
  sVar8 = mb->literal_histograms_size;
  sVar19 = local_b58.histogram_length_ * sVar8;
  if (sVar19 == 0) {
    local_b58.depths_ = (uint8_t *)0x0;
    local_b58.bits_ = (uint16_t *)0x0;
  }
  else {
    local_b58.depths_ = (uint8_t *)BrotliAllocate(m,sVar19);
    local_b58.bits_ = (uint16_t *)BrotliAllocate(m,sVar19 * 2);
  }
  if (sVar8 != 0) {
    sVar19 = 0;
    do {
      BuildAndStoreHuffmanTree
                (histogram->data_,local_b58.histogram_length_,0x100,tree,
                 local_b58.depths_ + local_b58.histogram_length_ * sVar19,
                 local_b58.bits_ + local_b58.histogram_length_ * sVar19,storage_ix,storage);
      sVar19 = sVar19 + 1;
      histogram = histogram + 1;
    } while (sVar8 != sVar19);
  }
  histogram_00 = mb->command_histograms;
  sVar8 = mb->command_histograms_size;
  sVar19 = local_7a0.histogram_length_ * sVar8;
  if (sVar19 == 0) {
    local_7a0.depths_ = (uint8_t *)0x0;
    local_7a0.bits_ = (uint16_t *)0x0;
  }
  else {
    local_7a0.depths_ = (uint8_t *)BrotliAllocate(m,sVar19);
    local_7a0.bits_ = (uint16_t *)BrotliAllocate(m,sVar19 * 2);
  }
  if (sVar8 != 0) {
    sVar19 = 0;
    do {
      BuildAndStoreHuffmanTree
                (histogram_00->data_,local_7a0.histogram_length_,0x2c0,tree,
                 local_7a0.depths_ + local_7a0.histogram_length_ * sVar19,
                 local_7a0.bits_ + local_7a0.histogram_length_ * sVar19,storage_ix,storage);
      sVar19 = sVar19 + 1;
      histogram_00 = histogram_00 + 1;
    } while (sVar8 != sVar19);
  }
  histogram_01 = mb->distance_histograms;
  sVar8 = mb->distance_histograms_size;
  sVar19 = local_3e8.histogram_length_ * sVar8;
  if (sVar19 == 0) {
    local_3e8.depths_ = (uint8_t *)0x0;
    local_3e8.bits_ = (uint16_t *)0x0;
  }
  else {
    local_3e8.depths_ = (uint8_t *)BrotliAllocate(m,sVar19);
    local_3e8.bits_ = (uint16_t *)BrotliAllocate(m,sVar19 * 2);
  }
  if (sVar8 != 0) {
    sVar19 = 0;
    do {
      BuildAndStoreHuffmanTree
                (histogram_01->data_,local_3e8.histogram_length_,(ulong)uVar17,tree,
                 local_3e8.depths_ + local_3e8.histogram_length_ * sVar19,
                 local_3e8.bits_ + local_3e8.histogram_length_ * sVar19,storage_ix,storage);
      sVar19 = sVar19 + 1;
      histogram_01 = histogram_01 + 1;
    } while (sVar8 != sVar19);
  }
  BrotliFree(m,tree);
  if (n_commands != 0) {
    uVar11 = (ulong)prev_byte2;
    sVar8 = 0;
    do {
      uVar17 = commands[sVar8].insert_len_;
      uVar12 = (ulong)uVar17;
      uVar18 = commands[sVar8].copy_len_;
      uVar4 = commands[sVar8].dist_extra_;
      uVar2 = commands[sVar8].cmd_prefix_;
      uVar3 = commands[sVar8].dist_prefix_;
      StoreSymbol(&local_7a0,(ulong)uVar2,storage_ix,storage);
      uVar13 = uVar17;
      if (5 < uVar12) {
        if (uVar17 < 0x82) {
          uVar13 = 0x1f;
          uVar10 = (uint)(uVar12 - 2);
          if (uVar10 != 0) {
            for (; uVar10 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = (uVar13 ^ 0xffffffe0) * 2 +
                   (int)(uVar12 - 2 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) + 0x40;
        }
        else if (uVar17 < 0x842) {
          uVar13 = 0x1f;
          if (uVar17 - 0x42 != 0) {
            for (; uVar17 - 0x42 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = (uVar13 ^ 0xffffffe0) + 0x2a;
        }
        else {
          uVar13 = 0x15;
          if (0x1841 < uVar17) {
            uVar13 = 0x17 - (uVar17 < 0x5842);
          }
        }
      }
      bVar1 = (byte)(uVar18 >> 0x18);
      uVar18 = uVar18 & 0x1ffffff;
      uVar10 = (int)(char)(bVar1 & 0x80 | bVar1 >> 1) + uVar18;
      if (uVar10 < 10) {
        uVar15 = uVar10 + 0xfffe;
      }
      else if (uVar10 < 0x86) {
        uVar15 = 0x1f;
        uVar7 = (uint)((ulong)uVar10 - 6);
        if (uVar7 != 0) {
          for (; uVar7 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        uVar15 = (uVar15 ^ 0xffffffe0) * 2 +
                 (int)((ulong)uVar10 - 6 >> ((char)(uVar15 ^ 0xffffffe0) + 0x1fU & 0x3f)) + 0x42;
      }
      else {
        uVar15 = 0x17;
        if (uVar10 < 0x846) {
          uVar15 = 0x1f;
          if (uVar10 - 0x46 != 0) {
            for (; uVar10 - 0x46 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          uVar15 = (uVar15 ^ 0xffffffe0) + 0x2c;
        }
      }
      uVar14 = (ulong)((uVar13 & 0xffff) << 2);
      iVar5 = *(int *)((long)kInsExtra + uVar14);
      uVar16 = (ulong)((uVar15 & 0xffff) << 2);
      iVar6 = *(int *)((long)kCopyExtra + uVar16);
      uVar9 = *storage_ix;
      *(ulong *)(storage + (uVar9 >> 3)) =
           ((ulong)(uVar10 - *(int *)((long)kCopyBase + uVar16)) << ((byte)iVar5 & 0x3f) |
           (ulong)(uVar17 - *(int *)((long)kInsBase + uVar14))) << ((byte)uVar9 & 7) |
           (ulong)storage[uVar9 >> 3];
      *storage_ix = (uint)(iVar5 + iVar6) + uVar9;
      if (mb->literal_context_map_size == 0) {
        if (uVar17 != 0) {
          do {
            StoreSymbol(&local_b58,(ulong)input[start_pos & mask],storage_ix,storage);
            start_pos = start_pos + 1;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
      }
      else {
        uVar9 = uVar11;
        uVar14 = (ulong)local_ba4;
        if (uVar17 != 0) {
          do {
            uVar11 = uVar14;
            bVar1 = input[start_pos & mask];
            local_ba4 = (uint)bVar1;
            StoreSymbolWithContext
                      (&local_b58,(ulong)bVar1,
                       (ulong)(""[uVar9 + (ulong)(literal_context_mode << 9) + 0x100] |
                              ""[uVar11 + (literal_context_mode << 9)]),mb->literal_context_map,
                       storage_ix,storage,6);
            start_pos = start_pos + 1;
            uVar12 = uVar12 - 1;
            uVar9 = uVar11;
            uVar14 = (ulong)bVar1;
          } while (uVar12 != 0);
        }
      }
      start_pos = start_pos + uVar18;
      if (uVar18 != 0) {
        uVar11 = (ulong)input[start_pos - 2 & mask];
        local_ba4 = (uint)input[start_pos - 1 & mask];
        if (0x7f < uVar2) {
          uVar12 = (ulong)(uVar3 & 0x3ff);
          if (mb->distance_context_map_size == 0) {
            StoreSymbol(&local_3e8,uVar12,storage_ix,storage);
          }
          else {
            uVar17 = uVar2 & 7;
            if (2 < uVar17) {
              uVar17 = 3;
            }
            sVar19 = 3;
            if (((uVar2 >> 6) - 2 & 0xfffffffd) == 0) {
              sVar19 = (ulong)uVar17;
            }
            if (uVar2 >> 6 == 7) {
              sVar19 = (ulong)uVar17;
            }
            StoreSymbolWithContext
                      (&local_3e8,uVar12,sVar19,mb->distance_context_map,storage_ix,storage,2);
          }
          uVar12 = *storage_ix;
          *(ulong *)(storage + (uVar12 >> 3)) =
               (ulong)uVar4 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
          *storage_ix = (uVar3 >> 10) + uVar12;
        }
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != n_commands);
  }
  BrotliFree(m,local_3e8.depths_);
  local_3e8.depths_ = (uint8_t *)0x0;
  BrotliFree(m,local_3e8.bits_);
  local_3e8.bits_ = (uint16_t *)0x0;
  BrotliFree(m,local_7a0.depths_);
  local_7a0.depths_ = (uint8_t *)0x0;
  BrotliFree(m,local_7a0.bits_);
  local_7a0.bits_ = (uint16_t *)0x0;
  BrotliFree(m,local_b58.depths_);
  local_b58.depths_ = (uint8_t *)0x0;
  BrotliFree(m,local_b58.bits_);
  if (is_last != 0) {
    uVar17 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar17 & 0xfffffff8);
    storage[uVar17 >> 3] = '\0';
  }
  return;
}

Assistant:

void BrotliStoreMetaBlock(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    uint8_t prev_byte, uint8_t prev_byte2, BROTLI_BOOL is_last,
    const BrotliEncoderParams* params, ContextType literal_context_mode,
    const Command* commands, size_t n_commands, const MetaBlockSplit* mb,
    size_t* storage_ix, uint8_t* storage) {

  size_t pos = start_pos;
  size_t i;
  uint32_t num_distance_symbols = params->dist.alphabet_size;
  uint32_t num_effective_distance_symbols = num_distance_symbols;
  HuffmanTree* tree;
  ContextLut literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);
  BlockEncoder literal_enc;
  BlockEncoder command_enc;
  BlockEncoder distance_enc;
  const BrotliDistanceParams* dist = &params->dist;
  if (params->large_window &&
      num_effective_distance_symbols > BROTLI_NUM_HISTOGRAM_DISTANCE_SYMBOLS) {
    num_effective_distance_symbols = BROTLI_NUM_HISTOGRAM_DISTANCE_SYMBOLS;
  }

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  if (BROTLI_IS_OOM(m)) return;
  InitBlockEncoder(&literal_enc, BROTLI_NUM_LITERAL_SYMBOLS,
      mb->literal_split.num_types, mb->literal_split.types,
      mb->literal_split.lengths, mb->literal_split.num_blocks);
  InitBlockEncoder(&command_enc, BROTLI_NUM_COMMAND_SYMBOLS,
      mb->command_split.num_types, mb->command_split.types,
      mb->command_split.lengths, mb->command_split.num_blocks);
  InitBlockEncoder(&distance_enc, num_effective_distance_symbols,
      mb->distance_split.num_types, mb->distance_split.types,
      mb->distance_split.lengths, mb->distance_split.num_blocks);

  BuildAndStoreBlockSwitchEntropyCodes(&literal_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(&command_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(
      &distance_enc, tree, storage_ix, storage);

  BrotliWriteBits(2, dist->distance_postfix_bits, storage_ix, storage);
  BrotliWriteBits(
      4, dist->num_direct_distance_codes >> dist->distance_postfix_bits,
      storage_ix, storage);
  for (i = 0; i < mb->literal_split.num_types; ++i) {
    BrotliWriteBits(2, literal_context_mode, storage_ix, storage);
  }

  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(mb->literal_histograms_size,
        BROTLI_LITERAL_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->literal_context_map, mb->literal_context_map_size,
        mb->literal_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(mb->distance_histograms_size,
        BROTLI_DISTANCE_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->distance_context_map, mb->distance_context_map_size,
        mb->distance_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  BuildAndStoreEntropyCodesLiteral(m, &literal_enc, mb->literal_histograms,
      mb->literal_histograms_size, BROTLI_NUM_LITERAL_SYMBOLS, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesCommand(m, &command_enc, mb->command_histograms,
      mb->command_histograms_size, BROTLI_NUM_COMMAND_SYMBOLS, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesDistance(m, &distance_enc, mb->distance_histograms,
      mb->distance_histograms_size, num_distance_symbols, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, tree);

  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t cmd_code = cmd.cmd_prefix_;
    StoreSymbol(&command_enc, cmd_code, storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    if (mb->literal_context_map_size == 0) {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        StoreSymbol(&literal_enc, input[pos & mask], storage_ix, storage);
        ++pos;
      }
    } else {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        size_t context =
            BROTLI_CONTEXT(prev_byte, prev_byte2, literal_context_lut);
        uint8_t literal = input[pos & mask];
        StoreSymbolWithContext(&literal_enc, literal, context,
            mb->literal_context_map, storage_ix, storage,
            BROTLI_LITERAL_CONTEXT_BITS);
        prev_byte2 = prev_byte;
        prev_byte = literal;
        ++pos;
      }
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd)) {
      prev_byte2 = input[(pos - 2) & mask];
      prev_byte = input[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        size_t dist_code = cmd.dist_prefix_ & 0x3FF;
        uint32_t distnumextra = cmd.dist_prefix_ >> 10;
        uint64_t distextra = cmd.dist_extra_;
        if (mb->distance_context_map_size == 0) {
          StoreSymbol(&distance_enc, dist_code, storage_ix, storage);
        } else {
          size_t context = CommandDistanceContext(&cmd);
          StoreSymbolWithContext(&distance_enc, dist_code, context,
              mb->distance_context_map, storage_ix, storage,
              BROTLI_DISTANCE_CONTEXT_BITS);
        }
        BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
      }
    }
  }
  CleanupBlockEncoder(m, &distance_enc);
  CleanupBlockEncoder(m, &command_enc);
  CleanupBlockEncoder(m, &literal_enc);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}